

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O0

void __thiscall
leveldb::_Test_ConsumeDecimalNumberRoundtripWithPadding::_Run
          (_Test_ConsumeDecimalNumberRoundtripWithPadding *this)

{
  unsigned_long uVar1;
  uint64_t number;
  allocator local_191;
  string local_190 [32];
  uint64_t local_170;
  uint64_t large_number;
  uint64_t i;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  _Test_ConsumeDecimalNumberRoundtripWithPadding *local_10;
  _Test_ConsumeDecimalNumberRoundtripWithPadding *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30," ",&local_31);
  ConsumeDecimalNumberRoundtripTest(0,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"abc",&local_69);
  ConsumeDecimalNumberRoundtripTest(1,(string *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"x",&local_91);
  ConsumeDecimalNumberRoundtripTest(9,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"_",&local_b9);
  ConsumeDecimalNumberRoundtripTest(10,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",3,&local_e1);
  ConsumeDecimalNumberRoundtripTest(0xb,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"abc",&local_109);
  ConsumeDecimalNumberRoundtripTest(0x13,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"padding",&local_131);
  ConsumeDecimalNumberRoundtripTest(99,(string *)local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158," ",(allocator *)((long)&i + 7));
  ConsumeDecimalNumberRoundtripTest(100,(string *)local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  for (large_number = 0; large_number < 100; large_number = large_number + 1) {
    uVar1 = std::numeric_limits<unsigned_long>::max();
    number = uVar1 - large_number;
    local_170 = number;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"pad",&local_191);
    ConsumeDecimalNumberRoundtripTest(number,(string *)local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  return;
}

Assistant:

TEST(Logging, ConsumeDecimalNumberRoundtripWithPadding) {
  ConsumeDecimalNumberRoundtripTest(0, " ");
  ConsumeDecimalNumberRoundtripTest(1, "abc");
  ConsumeDecimalNumberRoundtripTest(9, "x");

  ConsumeDecimalNumberRoundtripTest(10, "_");
  ConsumeDecimalNumberRoundtripTest(11, std::string("\0\0\0", 3));
  ConsumeDecimalNumberRoundtripTest(19, "abc");
  ConsumeDecimalNumberRoundtripTest(99, "padding");

  ConsumeDecimalNumberRoundtripTest(100, " ");

  for (uint64_t i = 0; i < 100; ++i) {
    uint64_t large_number = std::numeric_limits<uint64_t>::max() - i;
    ConsumeDecimalNumberRoundtripTest(large_number, "pad");
  }
}